

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerUnaryHelperMemWithBoolReference
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool useBoolForBailout)

{
  StackSym *pSVar1;
  SymOpnd *src;
  RegOpnd *dst;
  Instr *pIVar2;
  Func *pFVar3;
  SymOpnd *opndBailoutArg;
  
  pFVar3 = this->m_func;
  pSVar1 = pFVar3->tempSymBool;
  if (pSVar1 == (StackSym *)0x0) {
    pSVar1 = StackSym::New(TyUint8,pFVar3);
    pFVar3 = this->m_func;
    pFVar3->tempSymBool = pSVar1;
    Func::StackAllocate(pFVar3,pSVar1,1);
    pFVar3 = this->m_func;
    pSVar1 = pFVar3->tempSymBool;
  }
  src = IR::SymOpnd::New(&pSVar1->super_Sym,TyUint8,pFVar3);
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  InsertLea(dst,&src->super_Opnd,instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&dst->super_Opnd);
  opndBailoutArg = (SymOpnd *)0x0;
  if (useBoolForBailout) {
    opndBailoutArg = src;
  }
  LoadScriptContext(this,instr);
  pIVar2 = LowerUnaryHelper(this,instr,helperMethod,&opndBailoutArg->super_Opnd);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerUnaryHelperMemWithBoolReference(IR::Instr *instr, IR::JnHelperMethod helperMethod, bool useBoolForBailout)
{
    if (!this->m_func->tempSymBool)
    {
        this->m_func->tempSymBool = StackSym::New(TyUint8, this->m_func);
        this->m_func->StackAllocate(this->m_func->tempSymBool, TySize[TyUint8]);
    }
    IR::SymOpnd * boolOpnd = IR::SymOpnd::New(this->m_func->tempSymBool, TyUint8, this->m_func);
    IR::RegOpnd * boolRefOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    InsertLea(boolRefOpnd, boolOpnd, instr);

    m_lowererMD.LoadHelperArgument(instr, boolRefOpnd);

    return this->LowerUnaryHelperMem(instr, helperMethod, useBoolForBailout ? boolOpnd : nullptr);
}